

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall
crnlib::crn_comp::pack_blocks
          (crn_comp *this,uint group,bool clear_histograms,symbol_codec *pCodec,
          vector<unsigned_short> *pColor_endpoint_remap,
          vector<unsigned_short> *pColor_selector_remap,
          vector<unsigned_short> *pAlpha_endpoint_remap,
          vector<unsigned_short> *pAlpha_selector_remap)

{
  uint8 uVar1;
  ushort uVar2;
  uint uVar3;
  level_details *plVar4;
  endpoint_indices_details *peVar5;
  long *plVar6;
  uint *puVar7;
  void *pvVar8;
  uint8 uVar9;
  symbol_histogram *psVar10;
  undefined1 *puVar11;
  byte bVar12;
  uint c;
  uint uVar13;
  uint uVar14;
  long lVar15;
  vector<unsigned_short> *pvVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint sym;
  byte bVar21;
  uint c_1;
  bool bVar22;
  uint endpoint_index [3];
  vector<unsigned_short> *selector_remap [3];
  vector<unsigned_short> *endpoint_remap [3];
  uint local_98 [4];
  static_huffman_data_model *local_88;
  symbol_histogram *local_80;
  undefined1 *local_78;
  ulong local_70;
  long local_68 [4];
  long local_48 [3];
  
  if (pCodec == (symbol_codec *)0x0) {
    uVar3 = (this->m_reference_hist).m_hist.m_size;
    if (uVar3 != 0x100) {
      if (uVar3 < 0x101) {
        if ((this->m_reference_hist).m_hist.m_capacity < 0x100) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_reference_hist,0x100,uVar3 == 0xff,4,
                     (object_mover)0x0,false);
        }
        uVar3 = (this->m_reference_hist).m_hist.m_size;
        memset((this->m_reference_hist).m_hist.m_p + uVar3,0,(ulong)(0x100 - uVar3) << 2);
      }
      (this->m_reference_hist).m_hist.m_size = 0x100;
    }
    if ((clear_histograms) && ((this->m_reference_hist).m_hist.m_size != 0)) {
      puVar7 = (this->m_reference_hist).m_hist.m_p;
      uVar17 = 0;
      do {
        puVar7[uVar17] = 0;
        uVar17 = uVar17 + 1;
      } while (uVar17 < (this->m_reference_hist).m_hist.m_size);
    }
    if (pColor_endpoint_remap != (vector<unsigned_short> *)0x0) {
      uVar3 = pColor_endpoint_remap->m_size;
      uVar18 = this->m_endpoint_index_hist[0].m_hist.m_size;
      if (uVar18 != uVar3) {
        if (uVar18 <= uVar3) {
          if (this->m_endpoint_index_hist[0].m_hist.m_capacity < uVar3) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this->m_endpoint_index_hist,uVar3,uVar18 + 1 == uVar3,4,
                       (object_mover)0x0,false);
          }
          uVar18 = this->m_endpoint_index_hist[0].m_hist.m_size;
          memset(this->m_endpoint_index_hist[0].m_hist.m_p + uVar18,0,(ulong)(uVar3 - uVar18) << 2);
        }
        this->m_endpoint_index_hist[0].m_hist.m_size = uVar3;
      }
      if ((clear_histograms) && (this->m_endpoint_index_hist[0].m_hist.m_size != 0)) {
        puVar7 = this->m_endpoint_index_hist[0].m_hist.m_p;
        uVar17 = 0;
        do {
          puVar7[uVar17] = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->m_endpoint_index_hist[0].m_hist.m_size);
      }
    }
    if (pColor_selector_remap != (vector<unsigned_short> *)0x0) {
      uVar3 = pColor_selector_remap->m_size;
      uVar18 = this->m_selector_index_hist[0].m_hist.m_size;
      if (uVar18 != uVar3) {
        if (uVar18 <= uVar3) {
          if (this->m_selector_index_hist[0].m_hist.m_capacity < uVar3) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this->m_selector_index_hist,uVar3,uVar18 + 1 == uVar3,4,
                       (object_mover)0x0,false);
          }
          uVar18 = this->m_selector_index_hist[0].m_hist.m_size;
          memset(this->m_selector_index_hist[0].m_hist.m_p + uVar18,0,(ulong)(uVar3 - uVar18) << 2);
        }
        this->m_selector_index_hist[0].m_hist.m_size = uVar3;
      }
      if ((clear_histograms) && (this->m_selector_index_hist[0].m_hist.m_size != 0)) {
        puVar7 = this->m_selector_index_hist[0].m_hist.m_p;
        uVar17 = 0;
        do {
          puVar7[uVar17] = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->m_selector_index_hist[0].m_hist.m_size);
      }
    }
    if (pAlpha_endpoint_remap != (vector<unsigned_short> *)0x0) {
      uVar3 = pAlpha_endpoint_remap->m_size;
      uVar18 = this->m_endpoint_index_hist[1].m_hist.m_size;
      if (uVar18 != uVar3) {
        if (uVar18 <= uVar3) {
          if (this->m_endpoint_index_hist[1].m_hist.m_capacity < uVar3) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)(this->m_endpoint_index_hist + 1),uVar3,
                       uVar18 + 1 == uVar3,4,(object_mover)0x0,false);
          }
          uVar18 = this->m_endpoint_index_hist[1].m_hist.m_size;
          memset(this->m_endpoint_index_hist[1].m_hist.m_p + uVar18,0,(ulong)(uVar3 - uVar18) << 2);
        }
        this->m_endpoint_index_hist[1].m_hist.m_size = uVar3;
      }
      if ((clear_histograms) && (this->m_endpoint_index_hist[1].m_hist.m_size != 0)) {
        pvVar8 = ((elemental_vector *)(this->m_endpoint_index_hist + 1))->m_p;
        uVar17 = 0;
        do {
          *(undefined4 *)((long)pvVar8 + uVar17 * 4) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->m_endpoint_index_hist[1].m_hist.m_size);
      }
    }
    if (pAlpha_selector_remap != (vector<unsigned_short> *)0x0) {
      uVar3 = pAlpha_selector_remap->m_size;
      uVar18 = this->m_selector_index_hist[1].m_hist.m_size;
      if (uVar18 != uVar3) {
        if (uVar18 <= uVar3) {
          if (this->m_selector_index_hist[1].m_hist.m_capacity < uVar3) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)(this->m_selector_index_hist + 1),uVar3,
                       uVar18 + 1 == uVar3,4,(object_mover)0x0,false);
          }
          uVar18 = this->m_selector_index_hist[1].m_hist.m_size;
          memset(this->m_selector_index_hist[1].m_hist.m_p + uVar18,0,(ulong)(uVar3 - uVar18) << 2);
        }
        this->m_selector_index_hist[1].m_hist.m_size = uVar3;
      }
      if ((clear_histograms) && (this->m_selector_index_hist[1].m_hist.m_size != 0)) {
        pvVar8 = ((elemental_vector *)(this->m_selector_index_hist + 1))->m_p;
        uVar17 = 0;
        do {
          *(undefined4 *)((long)pvVar8 + uVar17 * 4) = 0;
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->m_selector_index_hist[1].m_hist.m_size);
      }
    }
  }
  lVar15 = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_48[2] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_68[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  do {
    if (this->m_has_comp[lVar15] == true) {
      pvVar16 = pAlpha_endpoint_remap;
      if (lVar15 == 0) {
        pvVar16 = pColor_endpoint_remap;
      }
      local_48[lVar15] = (long)pvVar16;
      pvVar16 = pAlpha_selector_remap;
      if (lVar15 == 0) {
        pvVar16 = pColor_selector_remap;
      }
      local_68[lVar15] = (long)pvVar16;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  plVar4 = (this->m_levels).m_p;
  uVar3 = plVar4[group].first_block;
  uVar17 = (ulong)uVar3;
  uVar18 = plVar4[group].num_blocks + uVar3;
  if (uVar3 < uVar18) {
    uVar3 = plVar4[group].block_width;
    local_88 = &this->m_reference_dm;
    uVar14 = 0;
    local_78 = &this->field_0x1fc0;
    local_80 = this->m_selector_index_hist;
    do {
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          iVar19 = (int)uVar17;
          bVar21 = this->m_has_subblocks & (byte)uVar13;
          if (((uVar13 | uVar14) & 1) == 0) {
            peVar5 = (this->m_endpoint_indices).m_p;
            bVar12 = peVar5[uVar3 + iVar19 + 1].reference << 6 | peVar5[iVar19 + 1].reference << 4 |
                     peVar5[iVar19 + uVar3].reference << 2 | peVar5[uVar17].reference;
            if (pCodec == (symbol_codec *)0x0) {
              puVar7 = (this->m_reference_hist).m_hist.m_p + bVar12;
              *puVar7 = *puVar7 + 1;
            }
            else {
              symbol_codec::encode(pCodec,(uint)bVar12,local_88);
            }
          }
          local_70 = uVar17;
          uVar20 = 0;
          do {
            plVar6 = (long *)local_48[uVar20];
            if (plVar6 != (long *)0x0) {
              peVar5 = (this->m_endpoint_indices).m_p;
              uVar2 = *(ushort *)(*plVar6 + (ulong)peVar5[uVar17].field_0.component[uVar20] * 2);
              uVar1 = peVar5[uVar17].reference;
              uVar9 = uVar1 == '\0';
              if (bVar21 != 0) {
                uVar9 = uVar1;
              }
              if (uVar9 != '\0') {
                sym = (uint)uVar2 - local_98[uVar20];
                if ((int)sym < 0) {
                  sym = sym + (int)plVar6[1];
                }
                if (pCodec == (symbol_codec *)0x0) {
                  puVar7 = this->m_endpoint_index_hist[uVar20 != 0].m_hist.m_p + sym;
                  *puVar7 = *puVar7 + 1;
                }
                else {
                  symbol_codec::encode
                            (pCodec,sym,
                             (static_huffman_data_model *)
                             ((long)this->m_endpoint_index_hist + (ulong)(uVar20 != 0) * 0x38 + 0x20
                             ));
                }
              }
              local_98[uVar20] = (uint)uVar2;
            }
            puVar11 = local_78;
            psVar10 = local_80;
            bVar22 = uVar20 < 2;
            uVar20 = uVar20 + 1;
          } while (bVar22 && bVar21 == 0);
          if (bVar21 == 0) {
            uVar20 = 0;
            do {
              if ((long *)local_68[uVar20] != (long *)0x0) {
                uVar2 = *(ushort *)
                         (*(long *)local_68[uVar20] +
                         (ulong)(this->m_selector_indices).m_p[uVar17].field_0.component[uVar20] * 2
                         );
                if (pCodec == (symbol_codec *)0x0) {
                  puVar7 = psVar10[uVar20 != 0].m_hist.m_p + uVar2;
                  *puVar7 = *puVar7 + 1;
                }
                else {
                  symbol_codec::encode
                            (pCodec,(uint)uVar2,
                             (static_huffman_data_model *)(puVar11 + (ulong)(uVar20 != 0) * 0x38));
                }
              }
              bVar22 = uVar20 < 2;
              uVar20 = uVar20 + 1;
            } while (bVar22);
          }
          uVar13 = uVar13 + 1;
          uVar17 = (ulong)((int)local_70 + 1);
        } while (uVar13 != uVar3);
      }
      uVar14 = uVar14 + 1;
    } while ((uint)uVar17 < uVar18);
  }
  return true;
}

Assistant:

bool crn_comp::pack_blocks(
        uint group,
        bool clear_histograms,
        symbol_codec* pCodec,
        const crnlib::vector<uint16>* pColor_endpoint_remap,
        const crnlib::vector<uint16>* pColor_selector_remap,
        const crnlib::vector<uint16>* pAlpha_endpoint_remap,
        const crnlib::vector<uint16>* pAlpha_selector_remap)
    {
        if (!pCodec)
        {
            m_reference_hist.resize(256);
            if (clear_histograms)
            {
                m_reference_hist.set_all(0);
            }

            if (pColor_endpoint_remap)
            {
                m_endpoint_index_hist[0].resize(pColor_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[0].set_all(0);
                }
            }

            if (pColor_selector_remap)
            {
                m_selector_index_hist[0].resize(pColor_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[0].set_all(0);
                }
            }

            if (pAlpha_endpoint_remap)
            {
                m_endpoint_index_hist[1].resize(pAlpha_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[1].set_all(0);
                }
            }

            if (pAlpha_selector_remap)
            {
                m_selector_index_hist[1].resize(pAlpha_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[1].set_all(0);
                }
            }
        }

        uint endpoint_index[cNumComps] = {};
        const crnlib::vector<uint16>* endpoint_remap[cNumComps] = {};
        const crnlib::vector<uint16>* selector_remap[cNumComps] = {};
        for (uint c = 0; c < cNumComps; c++)
        {
            if (m_has_comp[c])
            {
                endpoint_remap[c] = c ? pAlpha_endpoint_remap : pColor_endpoint_remap;
                selector_remap[c] = c ? pAlpha_selector_remap : pColor_selector_remap;
            }
        }

        uint block_width = m_levels[group].block_width;
        for (uint by = 0, b = m_levels[group].first_block, bEnd = b + m_levels[group].num_blocks; b < bEnd; by++)
        {
            for (uint bx = 0; bx < block_width; bx++, b++)
            {
                const bool secondary_etc_subblock = m_has_subblocks && bx & 1;
                if (!(by & 1) && !(bx & 1))
                {
                    uint8 reference_group = m_endpoint_indices[b].reference | m_endpoint_indices[b + block_width].reference << 2 |
                        m_endpoint_indices[b + 1].reference << 4 | m_endpoint_indices[b + block_width + 1].reference << 6;
                    if (pCodec)
                    {
                        pCodec->encode(reference_group, m_reference_dm);
                    }
                    else
                    {
                        m_reference_hist.inc_freq(reference_group);
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? cAlpha0 : cNumComps; c < cEnd; c++)
                {
                    if (endpoint_remap[c])
                    {
                        uint index = (*endpoint_remap[c])[m_endpoint_indices[b].component[c]];
                        if (secondary_etc_subblock ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                        {
                            int sym = index - endpoint_index[c];
                            if (sym < 0)
                            {
                                sym += endpoint_remap[c]->size();
                            }
                            if (!pCodec)
                            {
                                m_endpoint_index_hist[c ? 1 : 0].inc_freq(sym);
                            }
                            else
                            {
                                pCodec->encode(sym, m_endpoint_index_dm[c ? 1 : 0]);
                            }
                        }
                        endpoint_index[c] = index;
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? 0 : cNumComps; c < cEnd; c++)
                {
                    if (selector_remap[c])
                    {
                        uint index = (*selector_remap[c])[m_selector_indices[b].component[c]];
                        if (!pCodec)
                        {
                            m_selector_index_hist[c ? 1 : 0].inc_freq(index);
                        }
                        else
                        {
                            pCodec->encode(index, m_selector_index_dm[c ? 1 : 0]);
                        }
                    }
                }
            }
        }
        return true;
    }